

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int parse_auth_header(mg_connection *conn,char *buf,size_t buf_size,ah *ah)

{
  int iVar1;
  char *pcVar2;
  ushort **ppuVar3;
  ulonglong uVar4;
  ulong uVar5;
  ah *local_78;
  size_t buf_len_r;
  size_t userpw_b64_len;
  char *userpw_b64;
  char *split;
  uint64_t nonce;
  char *auth_header;
  char *s;
  char *value;
  char *name;
  ah *ah_local;
  size_t buf_size_local;
  char *buf_local;
  mg_connection *conn_local;
  
  if ((ah == (ah *)0x0) || (conn == (mg_connection *)0x0)) {
    conn_local._4_4_ = 0;
  }
  else {
    name = (char *)ah;
    ah_local = (ah *)buf_size;
    buf_size_local = (size_t)buf;
    buf_local = (char *)conn;
    memset(ah,0,0x48);
    nonce = (uint64_t)mg_get_header((mg_connection *)buf_local,"Authorization");
    if ((char *)nonce == (char *)0x0) {
      conn_local._4_4_ = 0;
    }
    else {
      iVar1 = mg_strncasecmp((char *)nonce,"Basic ",6);
      if (iVar1 == 0) {
        userpw_b64_len = nonce + 6;
        buf_len_r = strlen((char *)userpw_b64_len);
        local_78 = ah_local;
        iVar1 = mg_base64_decode((char *)userpw_b64_len,buf_len_r,(uchar *)buf_size_local,
                                 (size_t *)&local_78);
        if (iVar1 == -1) {
          pcVar2 = strchr((char *)buf_size_local,0x3a);
          if (pcVar2 == (char *)0x0) {
            conn_local._4_4_ = 0;
          }
          else {
            *pcVar2 = '\0';
            *(size_t *)name = buf_size_local;
            name[8] = '\x01';
            name[9] = '\0';
            name[10] = '\0';
            name[0xb] = '\0';
            *(char **)(name + 0x10) = pcVar2 + 1;
            conn_local._4_4_ = 1;
          }
        }
        else {
          conn_local._4_4_ = 0;
        }
      }
      else {
        iVar1 = mg_strncasecmp((char *)nonce,"Digest ",7);
        if (iVar1 == 0) {
          name[8] = '\x02';
          name[9] = '\0';
          name[10] = '\0';
          name[0xb] = '\0';
          mg_strlcpy((char *)buf_size_local,(char *)(nonce + 7),(size_t)ah_local);
          auth_header = (char *)buf_size_local;
          while( true ) {
            while (ppuVar3 = __ctype_b_loc(),
                  ((*ppuVar3)[(int)(uint)(byte)*auth_header] & 0x2000) != 0) {
              auth_header = auth_header + 1;
            }
            value = skip_quoted(&auth_header,"="," ",'\0');
            if (*auth_header == '\"') {
              auth_header = auth_header + 1;
              s = skip_quoted(&auth_header,"\""," ",'\\');
              if (*auth_header == ',') {
                auth_header = auth_header + 1;
              }
            }
            else {
              s = skip_quoted(&auth_header,", "," ",'\0');
            }
            if (*value == '\0') break;
            iVar1 = strcmp(value,"username");
            if (iVar1 == 0) {
              *(char **)name = s;
            }
            else {
              iVar1 = strcmp(value,"cnonce");
              if (iVar1 == 0) {
                *(char **)(name + 0x20) = s;
              }
              else {
                iVar1 = strcmp(value,"response");
                if (iVar1 == 0) {
                  *(char **)(name + 0x28) = s;
                }
                else {
                  iVar1 = strcmp(value,"uri");
                  if (iVar1 == 0) {
                    *(char **)(name + 0x18) = s;
                  }
                  else {
                    iVar1 = strcmp(value,"qop");
                    if (iVar1 == 0) {
                      *(char **)(name + 0x30) = s;
                    }
                    else {
                      iVar1 = strcmp(value,"nc");
                      if (iVar1 == 0) {
                        *(char **)(name + 0x38) = s;
                      }
                      else {
                        iVar1 = strcmp(value,"nonce");
                        if (iVar1 == 0) {
                          *(char **)(name + 0x40) = s;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          if (*(long *)(name + 0x40) == 0) {
            conn_local._4_4_ = 0;
          }
          else {
            auth_header = (char *)0x0;
            uVar4 = strtoull(*(char **)(name + 0x40),&auth_header,10);
            if ((auth_header == (char *)0x0) || (*auth_header != '\0')) {
              conn_local._4_4_ = 0;
            }
            else {
              uVar5 = *(ulong *)(*(long *)(buf_local + 0x8e8) + 0x1e8) ^ uVar4;
              if (uVar5 < *(ulong *)(*(long *)(buf_local + 0x8e0) + 0x282e0)) {
                conn_local._4_4_ = 0;
              }
              else if (uVar5 < (ulong)(*(long *)(*(long *)(buf_local + 0x8e0) + 0x282e0) +
                                      *(long *)(*(long *)(buf_local + 0x8e8) + 0x1f0))) {
                conn_local._4_4_ = (uint)(*(long *)name != 0);
              }
              else {
                conn_local._4_4_ = 0;
              }
            }
          }
        }
        else {
          conn_local._4_4_ = 0;
        }
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static int
parse_auth_header(struct mg_connection *conn,
                  char *buf,
                  size_t buf_size,
                  struct ah *ah)
{
	char *name, *value, *s;
	const char *auth_header;
	uint64_t nonce;

	if (!ah || !conn) {
		return 0;
	}

	(void)memset(ah, 0, sizeof(*ah));
	auth_header = mg_get_header(conn, "Authorization");

	if (auth_header == NULL) {
		/* No Authorization header at all */
		return 0;
	}
	if (0 == mg_strncasecmp(auth_header, "Basic ", 6)) {
		/* Basic Auth (we never asked for this, but some client may send it) */
		char *split;
		const char *userpw_b64 = auth_header + 6;
		size_t userpw_b64_len = strlen(userpw_b64);
		size_t buf_len_r = buf_size;
		if (mg_base64_decode(
		        userpw_b64, userpw_b64_len, (unsigned char *)buf, &buf_len_r)
		    != -1) {
			return 0; /* decode error */
		}
		split = strchr(buf, ':');
		if (!split) {
			return 0; /* Format error */
		}

		/* Separate string at ':' */
		*split = 0;

		/* User name is before ':', Password is after ':'  */
		ah->user = buf;
		ah->type = 1;
		ah->plain_password = split + 1;

		return 1;

	} else if (0 == mg_strncasecmp(auth_header, "Digest ", 7)) {
		/* Digest Auth ... implemented below */
		ah->type = 2;

	} else {
		/* Unknown or invalid Auth method */
		return 0;
	}

	/* Make modifiable copy of the auth header */
	(void)mg_strlcpy(buf, auth_header + 7, buf_size);
	s = buf;

	/* Parse authorization header */
	for (;;) {
		/* Gobble initial spaces */
		while (isspace((unsigned char)*s)) {
			s++;
		}
		name = skip_quoted(&s, "=", " ", 0);
		/* Value is either quote-delimited, or ends at first comma or space.
		 */
		if (s[0] == '\"') {
			s++;
			value = skip_quoted(&s, "\"", " ", '\\');
			if (s[0] == ',') {
				s++;
			}
		} else {
			value = skip_quoted(&s, ", ", " ", 0); /* IE uses commas, FF
			                                        * uses spaces */
		}
		if (*name == '\0') {
			break;
		}

		if (!strcmp(name, "username")) {
			ah->user = value;
		} else if (!strcmp(name, "cnonce")) {
			ah->cnonce = value;
		} else if (!strcmp(name, "response")) {
			ah->response = value;
		} else if (!strcmp(name, "uri")) {
			ah->uri = value;
		} else if (!strcmp(name, "qop")) {
			ah->qop = value;
		} else if (!strcmp(name, "nc")) {
			ah->nc = value;
		} else if (!strcmp(name, "nonce")) {
			ah->nonce = value;
		}
	}

#if !defined(NO_NONCE_CHECK)
	/* Read the nonce from the response. */
	if (ah->nonce == NULL) {
		return 0;
	}
	s = NULL;
	nonce = strtoull(ah->nonce, &s, 10);
	if ((s == NULL) || (*s != 0)) {
		return 0;
	}

	/* Convert the nonce from the client to a number. */
	nonce ^= conn->dom_ctx->auth_nonce_mask;

	/* The converted number corresponds to the time the nounce has been
	 * created. This should not be earlier than the server start. */
	/* Server side nonce check is valuable in all situations but one:
	 * if the server restarts frequently, but the client should not see
	 * that, so the server should accept nonces from previous starts. */
	/* However, the reasonable default is to not accept a nonce from a
	 * previous start, so if anyone changed the access rights between
	 * two restarts, a new login is required. */
	if (nonce < (uint64_t)conn->phys_ctx->start_time) {
		/* nonce is from a previous start of the server and no longer valid
		 * (replay attack?) */
		return 0;
	}
	/* Check if the nonce is too high, so it has not (yet) been used by the
	 * server. */
	if (nonce >= ((uint64_t)conn->phys_ctx->start_time
	              + conn->dom_ctx->nonce_count)) {
		return 0;
	}
#else
	(void)nonce;
#endif

	return (ah->user != NULL);
}